

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethpccal.cpp
# Opt level: O0

int __thiscall
icu_63::EthiopicCalendar::clone
          (EthiopicCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  EthiopicCalendar *this_00;
  undefined8 local_30;
  EthiopicCalendar *this_local;
  
  this_00 = (EthiopicCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  local_30 = (EthiopicCalendar *)0x0;
  if (this_00 != (EthiopicCalendar *)0x0) {
    EthiopicCalendar(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Calendar*
EthiopicCalendar::clone() const
{
    return new EthiopicCalendar(*this);
}